

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::exception<ki::dml::value_error>::exception
          (exception<ki::dml::value_error> *this,handle scope,char *name,PyObject *base)

{
  bool bVar1;
  PyObject *pPVar2;
  string full_name;
  allocator local_c9;
  undefined1 local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [24];
  object local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  local_68._16_8_ = "__name__";
  local_50.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_68._8_8_ = scope.m_ptr;
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
            (&local_a8,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_68);
  std::__cxx11::string::string((string *)&local_88,".",&local_c9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 &local_a8,&local_88);
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,name)
  ;
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  object::~object(&local_50);
  pPVar2 = (PyObject *)PyErr_NewException(local_48._M_dataplus._M_p,base,0);
  (this->super_object).super_handle.m_ptr = pPVar2;
  bVar1 = hasattr(scope,name);
  if (!bVar1) {
    local_c8._24_8_ = 0;
    local_c8._8_8_ = scope.m_ptr;
    local_c8._16_8_ = name;
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_c8,this);
    object::~object((object *)(local_c8 + 0x18));
    std::__cxx11::string::~string((string *)&local_48);
    return;
  }
  std::__cxx11::string::string((string *)local_68,name,(allocator *)&local_88);
  std::operator+(&local_a8,
                 "Error during initialization: multiple incompatible definitions with name \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 &local_a8,"\"");
  pybind11_fail((string *)local_c8);
}

Assistant:

exception(handle scope, const char *name, PyObject *base = PyExc_Exception) {
        std::string full_name = scope.attr("__name__").cast<std::string>() +
                                std::string(".") + name;
        m_ptr = PyErr_NewException(const_cast<char *>(full_name.c_str()), base, NULL);
        if (hasattr(scope, name))
            pybind11_fail("Error during initialization: multiple incompatible "
                          "definitions with name \"" + std::string(name) + "\"");
        scope.attr(name) = *this;
    }